

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O0

bool __thiscall QThreadPool::tryStart(QThreadPool *this,function<void_()> *functionToRun)

{
  bool bVar1;
  QRunnable *pQVar2;
  long in_FS_OFFSET;
  QRunnable *runnable;
  QThreadPoolPrivate *d;
  QMutexLocker<QMutex> locker;
  function<void_()> *in_stack_ffffffffffffff38;
  function<void_()> *in_stack_ffffffffffffff40;
  QThreadPoolPrivate *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  QThreadPoolPrivate *this_00;
  bool local_39;
  QObject **local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::function::operator_cast_to_bool((function<void_()> *)0x1f8ccd);
  if (bVar1) {
    d_func((QThreadPool *)0x1f8ce8);
    local_18 = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
    QMutexLocker<QMutex>::QMutexLocker
              ((QMutexLocker<QMutex> *)in_stack_ffffffffffffff40,(QMutex *)in_stack_ffffffffffffff38
              );
    bVar1 = QSet<QThreadPoolThread_*>::isEmpty((QSet<QThreadPoolThread_*> *)0x1f8d20);
    if ((bVar1) ||
       (bVar1 = QThreadPoolPrivate::areAllThreadsActive(in_stack_ffffffffffffff50), !bVar1)) {
      this_00 = (QThreadPoolPrivate *)&stack0xffffffffffffffc8;
      std::function<void_()>::function(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      pQVar2 = QRunnable::create((function<void_()> *)0x1f8d97);
      std::function<void_()>::~function((function<void_()> *)0x1f8dab);
      bVar1 = QThreadPoolPrivate::tryStart
                        (this_00,(QRunnable *)
                                 CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      if (bVar1) {
        local_39 = true;
      }
      else {
        if (pQVar2 != (QRunnable *)0x0) {
          (*pQVar2->_vptr_QRunnable[2])();
        }
        local_39 = false;
      }
    }
    else {
      local_39 = false;
    }
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_ffffffffffffff40);
  }
  else {
    local_39 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_39;
}

Assistant:

bool QThreadPool::tryStart(std::function<void()> functionToRun)
{
    if (!functionToRun)
        return false;

    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);
    if (!d->allThreads.isEmpty() && d->areAllThreadsActive())
        return false;

    QRunnable *runnable = QRunnable::create(std::move(functionToRun));
    if (d->tryStart(runnable))
        return true;
    delete runnable;
    return false;
}